

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_AActor_A_FreezeDeathChunks
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  AActor *ent;
  player_t *ppVar4;
  PClass *pPVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 extraout_var;
  PClassActor *pPVar11;
  AActor *pAVar12;
  APlayerPawn *this;
  undefined4 extraout_var_00;
  PClass *pPVar13;
  FState *pFVar14;
  char *__assertion;
  bool bVar15;
  DVector2 v;
  FName local_60;
  undefined4 uStack_5c;
  double dStack_58;
  FName local_50;
  FSoundID local_4c;
  DVector3 local_48;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      ent = *(AActor **)&param->field_0;
      if (ent != (AActor *)0x0) {
        if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
        }
        pPVar13 = (ent->super_DThinker).super_DObject.Class;
        bVar15 = pPVar13 != (PClass *)0x0;
        if (pPVar13 != pPVar5 && bVar15) {
          do {
            pPVar13 = pPVar13->ParentClass;
            bVar15 = pPVar13 != (PClass *)0x0;
            if (pPVar13 == pPVar5) break;
          } while (pPVar13 != (PClass *)0x0);
        }
        if (!bVar15) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004b46a4;
        }
      }
      dVar1 = (ent->Vel).X;
      if ((((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar1 = (ent->Vel).Y, dVar1 == 0.0)) &&
           ((!NAN(dVar1) && (dVar1 = (ent->Vel).Z, dVar1 == 0.0)))) && (!NAN(dVar1))) ||
         (((ent->flags6).Value & 0x20000) != 0)) {
        (ent->Vel).X = 0.0;
        (ent->Vel).Y = 0.0;
        (ent->Vel).Z = 0.0;
        local_4c.ID = S_FindSound("misc/icebreak");
        S_Sound(ent,4,&local_4c,1.0,1.0);
        iVar7 = (int)(ent->radius * ent->Height);
        iVar6 = iVar7 + 0x1f;
        if (-1 < iVar7) {
          iVar6 = iVar7;
        }
        uVar10 = iVar6 >> 5;
        if (iVar6 >> 5 < 5) {
          uVar10 = 4;
        }
        uVar8 = FRandom::GenRand32(&pr_freeze);
        uVar9 = FRandom::GenRand32(&pr_freeze);
        iVar7 = (int)((uVar8 & 0xff) - (uVar9 & 0xff)) % (int)(uVar10 >> 2) + uVar10;
        iVar6 = 0x18;
        if (0x18 < iVar7) {
          iVar6 = iVar7;
        }
        iVar6 = iVar6 + 1;
        do {
          uVar10 = FRandom::GenRand32(&pr_freeze);
          dVar1 = ent->radius;
          uVar8 = FRandom::GenRand32(&pr_freeze);
          dVar2 = ent->radius;
          uVar9 = FRandom::GenRand32(&pr_freeze);
          dVar3 = ent->Height;
          iVar7 = FName::NameManager::FindName(&FName::NameData,"IceChunk",false);
          P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,
                              (double)(int)((uVar10 & 0xff) - 0x80) * dVar1 * 0.0078125,
                              (double)(int)((uVar8 & 0xff) - 0x80) * dVar2 * 0.0078125);
          local_48.Z = ((double)(uVar9 & 0xff) * dVar3) / 255.0 + (ent->__Pos).Z;
          local_48.X = (double)CONCAT44(uStack_5c,local_60.Index);
          local_48.Y = dStack_58;
          local_60.Index = iVar7;
          pPVar11 = ClassForSpawn(&local_60);
          pAVar12 = AActor::StaticSpawn(pPVar11,&local_48,ALLOW_REPLACE,false);
          if (pAVar12 != (AActor *)0x0) {
            pFVar14 = pAVar12->SpawnState;
            uVar10 = FRandom::GenRand32(&pr_freeze);
            AActor::SetState(pAVar12,pFVar14 + (uVar10 & 0xff) % 3,false);
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            (pAVar12->Vel).X = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            (pAVar12->Vel).Y = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125;
            (pAVar12->Vel).Z = (((pAVar12->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0;
            pAVar12->RenderStyle = ent->RenderStyle;
            pAVar12->Alpha = ent->Alpha;
          }
          iVar7 = iVar6 + -1;
          bVar15 = 0 < iVar6;
          iVar6 = iVar7;
        } while (iVar7 != 0 && bVar15);
        if (ent->player != (player_t *)0x0) {
          local_60.Index = FName::NameManager::FindName(&FName::NameData,"IceChunkHead",false);
          local_48.X = (ent->__Pos).X;
          local_48.Y = (ent->__Pos).Y;
          local_48.Z = ent->player->mo->ViewHeight + (ent->__Pos).Z;
          pPVar11 = ClassForSpawn(&local_60);
          this = (APlayerPawn *)AActor::StaticSpawn(pPVar11,&local_48,ALLOW_REPLACE,false);
          if (this != (APlayerPawn *)0x0) {
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            (this->super_AActor).Vel.X = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125
            ;
            uVar10 = FRandom::GenRand32(&pr_freeze);
            uVar8 = FRandom::GenRand32(&pr_freeze);
            (this->super_AActor).Vel.Y = (double)(int)((uVar10 & 0xff) - (uVar8 & 0xff)) * 0.0078125
            ;
            (this->super_AActor).Vel.Z = (((pAVar12->__Pos).Z - (ent->__Pos).Z) / ent->Height) * 4.0
            ;
            (this->super_AActor).health = ent->health;
            (this->super_AActor).Angles.Yaw.Degrees = (ent->Angles).Yaw.Degrees;
            pPVar5 = APlayerPawn::RegistrationInfo.MyClass;
            if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
              iVar6 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
              (this->super_AActor).super_DThinker.super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar6);
            }
            pPVar13 = (this->super_AActor).super_DThinker.super_DObject.Class;
            bVar15 = pPVar13 != (PClass *)0x0;
            if (pPVar13 != pPVar5 && bVar15) {
              do {
                pPVar13 = pPVar13->ParentClass;
                bVar15 = pPVar13 != (PClass *)0x0;
                if (pPVar13 == pPVar5) break;
              } while (pPVar13 != (PClass *)0x0);
            }
            if (bVar15) {
              ppVar4 = ent->player;
              (this->super_AActor).player = ppVar4;
              ppVar4->mo = this;
              ent->player = (player_t *)0x0;
              AActor::ObtainInventory((AActor *)this,ent);
            }
            (this->super_AActor).Angles.Pitch.Degrees = 0.0;
            (this->super_AActor).RenderStyle = ent->RenderStyle;
            (this->super_AActor).Alpha = ent->Alpha;
            ppVar4 = (this->super_AActor).player;
            pAVar12 = (ppVar4->camera).field_0.p;
            if ((pAVar12 != (AActor *)0x0) &&
               (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (ppVar4->camera).field_0.p = (AActor *)0x0;
              pAVar12 = (AActor *)0x0;
            }
            if (pAVar12 == ent) {
              (((this->super_AActor).player)->camera).field_0.p = (AActor *)this;
            }
          }
        }
        if (((ent->flags4).Value & 8) != 0) {
          A_BossDeath(ent);
        }
        A_Unblock(ent,true);
        local_50.Index = 1;
        pFVar14 = AActor::FindState(ent,&local_50);
        AActor::SetState(ent,pFVar14,false);
      }
      else {
        ent->tics = 0x69;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004b46a4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x83,
                "int AF_AActor_A_FreezeDeathChunks(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_SELF_PROLOGUE(AActor);

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}